

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O1

void __thiscall
llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::
opt<char[18],llvm::cl::desc,llvm::cl::OptionHidden,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
          (opt<bool,false,llvm::cl::parser<bool>> *this,char (*Ms) [18],desc *Ms_1,
          OptionHidden *Ms_2,initializer<bool> *Ms_3,cat *Ms_4,sub *Ms_5)

{
  *(undefined4 *)(this + 8) = 0;
  *(ushort *)(this + 0xc) = *(ushort *)(this + 0xc) & 0xf000;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined8 *)(this + 0x20) = 0;
  *(undefined8 *)(this + 0x28) = 0;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 **)(this + 0x48) = &GeneralCategory;
  *(opt<bool,false,llvm::cl::parser<bool>> **)(this + 0x50) = this + 0x70;
  *(opt<bool,false,llvm::cl::parser<bool>> **)(this + 0x58) = this + 0x70;
  *(undefined8 *)(this + 0x60) = 4;
  *(undefined4 *)(this + 0x68) = 0;
  this[0x90] = (opt<bool,false,llvm::cl::parser<bool>>)0x0;
  this[0x98] = (opt<bool,false,llvm::cl::parser<bool>>)0x0;
  *(undefined ***)(this + 0xa0) = &PTR_compare_002049f0;
  *(undefined2 *)(this + 0xa8) = 0x100;
  *(undefined ***)this = &PTR_handleOccurrence_002048a8;
  *(undefined ***)(this + 0xb0) = &PTR_getValueName_00204398;
  apply<llvm::cl::opt<bool,false,llvm::cl::parser<bool>>,char[18],llvm::cl::desc,llvm::cl::OptionHidden,llvm::cl::initializer<bool>,llvm::cl::cat,llvm::cl::sub>
            ((opt<bool,_false,_llvm::cl::parser<bool>_> *)this,Ms,Ms_1,Ms_2,Ms_3,Ms_4,Ms_5);
  Option::addArgument((Option *)this);
  return;
}

Assistant:

explicit opt(const Mods &... Ms)
      : Option(Optional, NotHidden), Parser(*this) {
    apply(this, Ms...);
    done();
  }